

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

void report(long time,int count)

{
  ostream *poVar1;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    num: ",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", seconds: ",0xb);
  poVar1 = std::ostream::_M_insert<double>((double)time / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", num_per_second: ",0x12);
  poVar1 = std::ostream::_M_insert<double>((double)count / ((double)time / 1000.0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void report( long time, int count )
{
  double seconds = ( double ) time / 1000;
  double num_per_second = count / seconds;
  std::cout << std::endl << "    num: " << count
  << ", seconds: " << seconds
  << ", num_per_second: " << num_per_second << std::endl;
}